

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O3

short __thiscall
duckdb::Interpolator<true>::Operation<short,short,duckdb::QuantileDirect<short>>
          (Interpolator<true> *this,short *v_t,Vector *result,QuantileDirect<short> *accessor)

{
  bool bVar1;
  RESULT_TYPE_conflict input;
  unkbyte10 Var2;
  short result_1;
  short local_3a;
  string local_38;
  
  input = InterpolateInternal<short,duckdb::QuantileDirect<short>>(this,v_t,accessor);
  bVar1 = TryCast::Operation<short,short>(input,&local_3a,false);
  if (bVar1) {
    return local_3a;
  }
  Var2 = __cxa_allocate_exception(0x10);
  CastExceptionText<short,short>
            (&local_38,(duckdb *)(ulong)(uint)(int)input,(short)((unkuint10)Var2 >> 0x40));
  InvalidInputException::InvalidInputException((InvalidInputException *)Var2,(string *)&local_38);
  __cxa_throw((InvalidInputException *)Var2,&InvalidInputException::typeinfo,
              ::std::runtime_error::~runtime_error);
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(InterpolateInternal(v_t, accessor), result);
	}